

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O3

stbi_uc * dds_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  uint8 *__src;
  FILE *__stream;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint32 uVar12;
  byte bVar13;
  long lVar14;
  undefined4 in_register_00000084;
  uint uVar15;
  int iVar16;
  uint uVar17;
  stbi_uc compressed [8];
  DDS_header header;
  stbi_uc block [64];
  undefined8 local_168;
  uint local_15c;
  uint local_158;
  uint local_154;
  uchar *local_150;
  ulong local_148;
  ulong local_140;
  uint local_138;
  int local_134;
  uint local_130;
  uint local_12c;
  undefined8 local_128;
  int *local_120;
  uint32 *local_118;
  stbi *local_110;
  ulong local_108;
  ulong local_100;
  int local_f8;
  int local_f4;
  uint local_f0;
  uint32 local_ec;
  uint32 local_e8;
  uint local_dc;
  int local_ac;
  uint local_a8;
  uint local_a4;
  uint local_8c;
  uint local_88;
  uchar local_78 [72];
  
  local_128 = CONCAT44(in_register_00000084,req_comp);
  local_120 = comp;
  local_118 = (uint32 *)y;
  if ((FILE *)s->img_file == (FILE *)0x0) {
    __src = s->img_buffer;
    memcpy(&local_f8,__src,0x80);
    s->img_buffer = __src + 0x80;
  }
  else {
    fread(&local_f8,1,0x80,(FILE *)s->img_file);
  }
  if (local_f8 != 0x20534444) {
    return (stbi_uc *)0x0;
  }
  if (local_f4 != 0x7c) {
    return (stbi_uc *)0x0;
  }
  if ((~local_f0 & 0x1007) != 0) {
    return (stbi_uc *)0x0;
  }
  if (local_ac != 0x20) {
    return (stbi_uc *)0x0;
  }
  if (((local_a8 & 0x44) == 0) || ((local_8c >> 0xc & 1) == 0)) {
    return (stbi_uc *)0x0;
  }
  s->img_x = local_e8;
  s->img_y = local_ec;
  s->img_n = 4;
  local_140 = (ulong)local_dc;
  bVar13 = 1 < local_dc & (byte)(local_8c >> 0x16);
  local_158 = (local_88 >> 9 & 1) * 5 + 1;
  if (local_e8 != local_ec) {
    local_158 = 1;
  }
  *x = local_e8;
  *local_118 = s->img_y;
  *local_120 = s->img_n;
  if ((local_a8 & 4) == 0) {
    iVar3 = (local_a8 & 1) + 3;
    s->img_n = iVar3;
    *local_120 = iVar3;
    local_15c = s->img_x * local_158 * s->img_y * s->img_n;
    local_150 = (uchar *)(long)(int)local_15c;
    puVar6 = (uchar *)malloc((size_t)local_150);
    uVar15 = 0;
    do {
      iVar3 = s->img_y * s->img_x * s->img_n;
      getn(s,puVar6 + iVar3 * uVar15,iVar3);
      uVar10 = local_140;
      if (bVar13 != 0) {
        iVar3 = 1;
        do {
          uVar4 = s->img_x >> ((byte)iVar3 & 0x1f);
          uVar9 = s->img_y >> ((byte)iVar3 & 0x1f);
          if ((int)uVar4 < 2) {
            uVar4 = 1;
          }
          if ((int)uVar9 < 2) {
            uVar9 = 1;
          }
          lVar14 = (long)(int)(uVar4 * s->img_n * uVar9);
          if ((FILE *)s->img_file == (FILE *)0x0) {
            s->img_buffer = s->img_buffer + lVar14;
          }
          else {
            fseek((FILE *)s->img_file,lVar14,1);
          }
          iVar3 = iVar3 + 1;
        } while ((int)uVar10 != iVar3);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_158);
    uVar15 = local_158;
    if (0 < (int)local_15c) {
      iVar3 = s->img_n;
      lVar14 = 0;
      do {
        uVar1 = puVar6[lVar14];
        puVar6[lVar14] = puVar6[lVar14 + 2];
        puVar6[lVar14 + 2] = uVar1;
        lVar14 = lVar14 + iVar3;
      } while (lVar14 < (long)local_150);
    }
  }
  else {
    local_148 = 0;
    if (local_a4 + 0xca000000 < 0xfb000000) {
      return (stbi_uc *)0x0;
    }
    local_12c = local_e8 + 3 >> 2;
    local_154 = (local_ec + 3 >> 2) * local_12c;
    local_15c = s->img_x * local_158 * s->img_y * 4;
    local_150 = (uchar *)malloc((long)(int)local_15c);
    local_100 = (ulong)local_a4;
    local_130 = local_a4 & 0x37000000;
    local_134 = ((local_a4 & 0x37000000) != 0x31000000) + 3;
    local_138 = local_e8 + 3 & 0x3ffffffc;
    local_140 = (ulong)-local_dc;
    local_110 = s;
    do {
      if (0 < (int)local_154) {
        uVar10 = 0;
        do {
          uVar2 = (ulong)local_12c;
          __stream = (FILE *)s->img_file;
          local_108 = uVar10;
          if (local_130 == 0x31000000) {
            if (__stream == (FILE *)0x0) {
              local_168 = *(undefined8 *)s->img_buffer;
              s->img_buffer = s->img_buffer + 8;
            }
            else {
              fread(&local_168,1,8,__stream);
            }
            stbi_decode_DXT1_block(local_78,(uchar *)&local_168);
          }
          else {
            if ((uint)local_100 < 0x34000000) {
              if (__stream == (FILE *)0x0) {
                local_168 = *(undefined8 *)s->img_buffer;
                s->img_buffer = s->img_buffer + 8;
              }
              else {
                fread(&local_168,1,8,__stream);
              }
              uVar7 = 0;
              do {
                iVar3 = (*(byte *)((long)&local_168 + (uVar7 >> 3 & 0x1fffffff)) >>
                         ((byte)uVar7 & 4) & 0xf) * 0xff;
                local_78[uVar7 + 3] = (uchar)(iVar3 + (iVar3 + 8U >> 4) + 8 >> 4);
                uVar8 = uVar7 + 3;
                uVar7 = uVar7 + 4;
              } while (uVar8 < 0x3c);
            }
            else {
              if (__stream == (FILE *)0x0) {
                local_168 = *(undefined8 *)s->img_buffer;
                s->img_buffer = s->img_buffer + 8;
              }
              else {
                fread(&local_168,1,8,__stream);
              }
              stbi_decode_DXT45_alpha_block(local_78,(uchar *)&local_168);
            }
            if ((FILE *)s->img_file == (FILE *)0x0) {
              local_168 = *(undefined8 *)s->img_buffer;
              s->img_buffer = s->img_buffer + 8;
            }
            else {
              fread(&local_168,1,8,(FILE *)s->img_file);
            }
            stbi_decode_DXT_color_block(local_78,(uchar *)&local_168);
          }
          iVar3 = (int)(uVar10 / uVar2);
          uVar15 = s->img_y + iVar3 * -4;
          if (iVar3 * 4 + 4U <= s->img_y) {
            uVar15 = 4;
          }
          if (0 < (int)uVar15) {
            iVar5 = (int)local_108;
            iVar11 = (int)(uVar10 % uVar2);
            uVar4 = local_110->img_x;
            uVar9 = (uVar4 + iVar11 * -4) * 4;
            if (iVar11 * 4 + 4U <= uVar4) {
              uVar9 = 0x10;
            }
            iVar11 = (int)local_148;
            iVar16 = iVar3 * local_138;
            uVar17 = 0;
            uVar10 = 0;
            do {
              if (0 < (int)uVar9) {
                memcpy(local_150 +
                       (int)(uVar4 * 4 * (int)uVar10 +
                            (((iVar11 * uVar4 + iVar3 * 4) * uVar4 + iVar5 * 4) - iVar16) * 4),
                       local_78 + uVar17,(ulong)uVar9);
              }
              uVar10 = uVar10 + 1;
              uVar17 = uVar17 + 0x10;
            } while (uVar10 < uVar15);
          }
          uVar15 = (int)local_108 + 1;
          uVar10 = (ulong)uVar15;
          s = local_110;
        } while (uVar15 != local_154);
      }
      puVar6 = local_150;
      uVar15 = local_158;
      if (bVar13 != 0) {
        iVar3 = 3;
        do {
          uVar9 = s->img_x >> ((byte)iVar3 & 0x1f);
          uVar4 = s->img_y >> ((byte)iVar3 & 0x1f);
          iVar5 = (uVar4 + (uVar4 == 0)) * (uVar9 + (uVar9 == 0)) << ((byte)local_134 & 0x1f);
          if ((FILE *)s->img_file == (FILE *)0x0) {
            s->img_buffer = s->img_buffer + iVar5;
          }
          else {
            fseek((FILE *)s->img_file,(long)iVar5,1);
          }
          iVar5 = (int)local_140 + iVar3;
          iVar3 = iVar3 + 1;
        } while (iVar5 != 1);
      }
      uVar4 = (int)local_148 + 1;
      local_148 = (ulong)uVar4;
    } while (uVar4 != uVar15);
  }
  uVar12 = uVar15 * s->img_y;
  s->img_y = uVar12;
  *local_118 = uVar12;
  iVar3 = s->img_n;
  iVar5 = (int)local_128;
  if (iVar3 == 4) {
    if ((int)local_15c < 4) {
      if (iVar5 - 1U < 4) goto LAB_0015ad51;
    }
    else {
      uVar10 = 7;
      do {
        lVar14 = uVar10 - 4;
        if (local_15c <= uVar10) break;
        uVar10 = uVar10 + 4;
      } while (puVar6[lVar14] == 0xff);
      if (iVar5 - 1U < 4) {
LAB_0015ad51:
        if (iVar5 == 4) {
          return puVar6;
        }
        goto LAB_0015ad5a;
      }
      if (puVar6[lVar14] != 0xff) {
        return puVar6;
      }
    }
    iVar3 = 3;
    puVar6 = convert_format(puVar6,4,3,s->img_x,s->img_y);
  }
  else {
    if (iVar3 == iVar5 || iVar5 - 5U < 0xfffffffc) {
      return puVar6;
    }
LAB_0015ad5a:
    puVar6 = convert_format(puVar6,iVar3,iVar5,s->img_x,s->img_y);
    iVar3 = s->img_n;
  }
  *local_120 = iVar3;
  return puVar6;
}

Assistant:

static stbi_uc *dds_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	//	all variables go up front
	stbi_uc *dds_data = NULL;
	stbi_uc block[16*4];
	stbi_uc compressed[8];
	int flags, DXT_family;
	int has_alpha, has_mipmap;
	int is_compressed, cubemap_faces;
	int block_pitch, num_blocks;
	DDS_header header;
	int i, sz, cf;
	//	load the header
	if( sizeof( DDS_header ) != 128 )
	{
		return NULL;
	}
	getn( s, (stbi_uc*)(&header), 128 );
	//	and do some checking
	if( header.dwMagic != (('D' << 0) | ('D' << 8) | ('S' << 16) | (' ' << 24)) ) return NULL;
	if( header.dwSize != 124 ) return NULL;
	flags = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT;
	if( (header.dwFlags & flags) != flags ) return NULL;
	/*	According to the MSDN spec, the dwFlags should contain
		DDSD_LINEARSIZE if it's compressed, or DDSD_PITCH if
		uncompressed.  Some DDS writers do not conform to the
		spec, so I need to make my reader more tolerant	*/
	if( header.sPixelFormat.dwSize != 32 ) return NULL;
	flags = DDPF_FOURCC | DDPF_RGB;
	if( (header.sPixelFormat.dwFlags & flags) == 0 ) return NULL;
	if( (header.sCaps.dwCaps1 & DDSCAPS_TEXTURE) == 0 ) return NULL;
	//	get the image data
	s->img_x = header.dwWidth;
	s->img_y = header.dwHeight;
	s->img_n = 4;
	is_compressed = (header.sPixelFormat.dwFlags & DDPF_FOURCC) / DDPF_FOURCC;
	has_alpha = (header.sPixelFormat.dwFlags & DDPF_ALPHAPIXELS) / DDPF_ALPHAPIXELS;
	has_mipmap = (header.sCaps.dwCaps1 & DDSCAPS_MIPMAP) && (header.dwMipMapCount > 1);
	cubemap_faces = (header.sCaps.dwCaps2 & DDSCAPS2_CUBEMAP) / DDSCAPS2_CUBEMAP;
	/*	I need cubemaps to have square faces	*/
	cubemap_faces &= (s->img_x == s->img_y);
	cubemap_faces *= 5;
	cubemap_faces += 1;
	block_pitch = (s->img_x+3) >> 2;
	num_blocks = block_pitch * ((s->img_y+3) >> 2);
	/*	let the user know what's going on	*/
	*x = s->img_x;
	*y = s->img_y;
	*comp = s->img_n;
	/*	is this uncompressed?	*/
	if( is_compressed )
	{
		/*	compressed	*/
		//	note: header.sPixelFormat.dwFourCC is something like (('D'<<0)|('X'<<8)|('T'<<16)|('1'<<24))
		DXT_family = 1 + (header.sPixelFormat.dwFourCC >> 24) - '1';
		if( (DXT_family < 1) || (DXT_family > 5) ) return NULL;
		/*	check the expected size...oops, nevermind...
			those non-compliant writers leave
			dwPitchOrLinearSize == 0	*/
		//	passed all the tests, get the RAM for decoding
		sz = (s->img_x)*(s->img_y)*4*cubemap_faces;
		dds_data = (unsigned char*)malloc( sz );
		/*	do this once for each face	*/
		for( cf = 0; cf < cubemap_faces; ++ cf )
		{
			//	now read and decode all the blocks
			for( i = 0; i < num_blocks; ++i )
			{
				//	where are we?
				int bx, by, bw=4, bh=4;
				int ref_x = 4 * (i % block_pitch);
				int ref_y = 4 * (i / block_pitch);
				//	get the next block's worth of compressed data, and decompress it
				if( DXT_family == 1 )
				{
					//	DXT1
					getn( s, compressed, 8 );
					stbi_decode_DXT1_block( block, compressed );
				} else if( DXT_family < 4 )
				{
					//	DXT2/3
					getn( s, compressed, 8 );
					stbi_decode_DXT23_alpha_block ( block, compressed );
					getn( s, compressed, 8 );
					stbi_decode_DXT_color_block ( block, compressed );
				} else
				{
					//	DXT4/5
					getn( s, compressed, 8 );
					stbi_decode_DXT45_alpha_block ( block, compressed );
					getn( s, compressed, 8 );
					stbi_decode_DXT_color_block ( block, compressed );
				}
				//	is this a partial block?
				if( ref_x + 4 > s->img_x )
				{
					bw = s->img_x - ref_x;
				}
				if( ref_y + 4 > s->img_y )
				{
					bh = s->img_y - ref_y;
				}
				//	now drop our decompressed data into the buffer
				for( by = 0; by < bh; ++by )
				{
					int idx = 4*((ref_y+by+cf*s->img_x)*s->img_x + ref_x);
					for( bx = 0; bx < bw*4; ++bx )
					{

						dds_data[idx+bx] = block[by*16+bx];
					}
				}
			}
			/*	done reading and decoding the main image...
				skip MIPmaps if present	*/
			if( has_mipmap )
			{
				int block_size = 16;
				if( DXT_family == 1 )
				{
					block_size = 8;
				}
				for( i = 1; i < header.dwMipMapCount; ++i )
				{
					int mx = s->img_x >> (i + 2);
					int my = s->img_y >> (i + 2);
					if( mx < 1 )
					{
						mx = 1;
					}
					if( my < 1 )
					{
						my = 1;
					}
					skip( s, mx*my*block_size );
				}
			}
		}/* per cubemap face */
	} else
	{
		/*	uncompressed	*/
		DXT_family = 0;
		s->img_n = 3;
		if( has_alpha )
		{
			s->img_n = 4;
		}
		*comp = s->img_n;
		sz = s->img_x*s->img_y*s->img_n*cubemap_faces;
		dds_data = (unsigned char*)malloc( sz );
		/*	do this once for each face	*/
		for( cf = 0; cf < cubemap_faces; ++ cf )
		{
			/*	read the main image for this face	*/
			getn( s, &dds_data[cf*s->img_x*s->img_y*s->img_n], s->img_x*s->img_y*s->img_n );
			/*	done reading and decoding the main image...
				skip MIPmaps if present	*/
			if( has_mipmap )
			{
				for( i = 1; i < header.dwMipMapCount; ++i )
				{
					int mx = s->img_x >> i;
					int my = s->img_y >> i;
					if( mx < 1 )
					{
						mx = 1;
					}
					if( my < 1 )
					{
						my = 1;
					}
					skip( s, mx*my*s->img_n );
				}
			}
		}
		/*	data was BGR, I need it RGB	*/
		for( i = 0; i < sz; i += s->img_n )
		{
			unsigned char temp = dds_data[i];
			dds_data[i] = dds_data[i+2];
			dds_data[i+2] = temp;
		}
	}
	/*	finished decompressing into RGBA,
		adjust the y size if we have a cubemap
		note: sz is already up to date	*/
	s->img_y *= cubemap_faces;
	*y = s->img_y;
	//	did the user want something else, or
	//	see if all the alpha values are 255 (i.e. no transparency)
	has_alpha = 0;
	if( s->img_n == 4)
	{
		for( i = 3; (i < sz) && (has_alpha == 0); i += 4 )
		{
			has_alpha |= (dds_data[i] < 255);
		}
	}
	if( (req_comp <= 4) && (req_comp >= 1) )
	{
		//	user has some requirements, meet them
		if( req_comp != s->img_n )
		{
			dds_data = convert_format( dds_data, s->img_n, req_comp, s->img_x, s->img_y );
			*comp = s->img_n;
		}
	} else
	{
		//	user had no requirements, only drop to RGB is no alpha
		if( (has_alpha == 0) && (s->img_n == 4) )
		{
			dds_data = convert_format( dds_data, 4, 3, s->img_x, s->img_y );
			*comp = 3;
		}
	}
	//	OK, done
	return dds_data;
}